

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate.cc
# Opt level: O3

unique_ptr<bssl::Certificate,_std::default_delete<bssl::Certificate>_>
bssl::Certificate::FromDER(Span<const_unsigned_char> der,string *out_diagnostic)

{
  tuple<crypto_buffer_st_*,_bssl::internal::Deleter> tVar1;
  _Head_base<0UL,_crypto_buffer_st_*,_false> *p_Var2;
  undefined8 *puVar3;
  string *in_RCX;
  __uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true> _Var4;
  ParsedCertificate *__tmp;
  _Head_base<0UL,_crypto_buffer_st_*,_false> this;
  UniquePtr<CRYPTO_BUFFER> buffer;
  CertErrors errors;
  ParseCertificateOptions local_79;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_78;
  UniquePtr<CRYPTO_BUFFER> local_70;
  undefined1 local_68 [40];
  string local_40;
  
  _Var4.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
  super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
  super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>)der.data_;
  local_79.allow_invalid_serial_numbers = true;
  tVar1.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)
       CRYPTO_BUFFER_new((uint8_t *)der.size_,(size_t)out_diagnostic,(CRYPTO_BUFFER_POOL *)0x0);
  local_78._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       tVar1.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  CertErrors::CertErrors((CertErrors *)(local_68 + 0x10));
  local_78._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
  local_70._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       tVar1.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  ParsedCertificate::Create
            ((ParsedCertificate *)local_68,&local_70,&local_79,(CertErrors *)(local_68 + 0x10));
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_70);
  this._M_head_impl = (crypto_buffer_st *)local_68._8_8_;
  if ((crypto_buffer_st *)local_68._0_8_ == (crypto_buffer_st *)0x0) {
    CertErrors::ToDebugString_abi_cxx11_(&local_40,(CertErrors *)(local_68 + 0x10));
    ::std::__cxx11::string::operator=(in_RCX,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,(ulong)(local_40.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((crypto_buffer_st *)local_68._8_8_ != (crypto_buffer_st *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    this._M_head_impl = (crypto_buffer_st *)0x0;
  }
  CertErrors::~CertErrors((CertErrors *)(local_68 + 0x10));
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_78);
  if ((crypto_buffer_st *)local_68._0_8_ == (crypto_buffer_st *)0x0) {
    *(undefined8 *)
     _Var4.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
     super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
     super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl = 0;
    if (this._M_head_impl != (crypto_buffer_st *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_head_impl);
    }
  }
  else {
    p_Var2 = (_Head_base<0UL,_crypto_buffer_st_*,_false> *)operator_new(0x10);
    p_Var2->_M_head_impl = (crypto_buffer_st *)local_68._0_8_;
    p_Var2[1]._M_head_impl = this._M_head_impl;
    local_40._M_dataplus._M_p = (pointer)p_Var2;
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = p_Var2;
    *(undefined8 **)
     _Var4.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
     super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
     super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl = puVar3;
  }
  return (__uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true>)
         (tuple<bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>)
         _Var4.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
         _M_t.super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
         super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Certificate> Certificate::FromDER(bssl::Span<const uint8_t> der,
                                                  std::string *out_diagnostic) {
  std::shared_ptr<const bssl::ParsedCertificate> result =
      ParseCertificateFromDer(der, out_diagnostic);
  if (result == nullptr) {
    return nullptr;
  }

  auto internals = std::make_unique<CertificateInternals>();
  internals->cert = std::move(result);
  std::unique_ptr<Certificate> ret(new Certificate(std::move(internals)));
  return ret;
}